

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  string *filename_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  string filename;
  allocator_type local_ad;
  int local_ac;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string(local_90,argv[1],(allocator *)&local_a8);
  iVar2 = atoi(argv[2]);
  local_ac = atoi(argv[3]);
  iVar3 = atoi(argv[4]);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,(long)iVar3,
             &local_ad);
  for (uVar5 = 0; puVar1 = local_a8._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar5 = uVar5 + 1) {
    iVar3 = atoi(argv[uVar5 + 5]);
    puVar1[uVar5] = (long)iVar3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar4," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if (iVar2 == 0) {
    filename_00 = &local_50;
    std::__cxx11::string::string((string *)filename_00,local_90);
    test<float>(filename_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,
                local_ac);
  }
  else {
    if (iVar2 != 1) {
      std::operator<<((ostream *)&std::cerr,
                      "Only 0 (float) and 1 (double) are implemented in this test\n");
      exit(0);
    }
    filename_00 = &local_70;
    std::__cxx11::string::string((string *)filename_00,local_90);
    test<double>(filename_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,
                 local_ac);
  }
  std::__cxx11::string::~string((string *)filename_00);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
  std::__cxx11::string::~string(local_90);
  return 0;
}

Assistant:

int main(int argc, char ** argv){
    string filename = string(argv[1]);
    int type = atoi(argv[2]); // 0 for float, 1 for double
    int target_level = atoi(argv[3]);
    const int num_dims = atoi(argv[4]);
    vector<size_t> dims(num_dims);
    for(int i=0; i<dims.size(); i++){
       dims[i] = atoi(argv[5 + i]);
       cout << dims[i] << " ";
    }
    cout << endl;
    switch(type){
        case 0:
            {
                test<float>(filename, dims, target_level);
                break;
            }
        case 1:
            {
                test<double>(filename, dims, target_level);
                break;
            }
        default:
            cerr << "Only 0 (float) and 1 (double) are implemented in this test\n";
            exit(0);
    }
    return 0;
}